

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O3

void __thiscall btMultiBodyDynamicsWorld::forwardKinematics(btMultiBodyDynamicsWorld *this)

{
  long lVar1;
  btAlignedObjectArray<btVector3> local_origin;
  btAlignedObjectArray<btQuaternion> world_to_local;
  btAlignedObjectArray<btVector3> local_60;
  btAlignedObjectArray<btQuaternion> local_40;
  
  local_40.m_ownsMemory = true;
  local_40.m_data = (btQuaternion *)0x0;
  local_40.m_size = 0;
  local_40.m_capacity = 0;
  local_60.m_ownsMemory = true;
  local_60.m_data = (btVector3 *)0x0;
  local_60.m_size = 0;
  local_60.m_capacity = 0;
  if (0 < (this->m_multiBodies).m_size) {
    lVar1 = 0;
    do {
      btMultiBody::forwardKinematics((this->m_multiBodies).m_data[lVar1],&local_40,&local_60);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->m_multiBodies).m_size);
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_60);
  btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray(&local_40);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::forwardKinematics()
{
	btAlignedObjectArray<btQuaternion> world_to_local;
	btAlignedObjectArray<btVector3> local_origin;

	for (int b=0;b<m_multiBodies.size();b++)
	{
		btMultiBody* bod = m_multiBodies[b];
		bod->forwardKinematics(world_to_local,local_origin);
	}
}